

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::DOMRangeImpl::indexOf(DOMRangeImpl *this,DOMNode *child,DOMNode *parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *local_38;
  DOMNode *node;
  XMLSize_t i;
  DOMNode *parent_local;
  DOMNode *child_local;
  DOMRangeImpl *this_local;
  
  node = (DOMNode *)0x0;
  iVar1 = (*child->_vptr_DOMNode[5])();
  if ((DOMNode *)CONCAT44(extraout_var,iVar1) == parent) {
    iVar1 = (*child->_vptr_DOMNode[9])();
    for (local_38 = (long *)CONCAT44(extraout_var_00,iVar1); local_38 != (long *)0x0;
        local_38 = (long *)(**(code **)(*local_38 + 0x48))()) {
      node = (DOMNode *)((long)&node->_vptr_DOMNode + 1);
    }
    this_local = (DOMRangeImpl *)node;
  }
  else {
    this_local = (DOMRangeImpl *)0xffffffffffffffff;
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t DOMRangeImpl::indexOf(const DOMNode* child, const DOMNode* parent) const
{
    XMLSize_t i = 0;
    if (child->getParentNode() != parent) return (XMLSize_t)-1;
    for(DOMNode* node = child->getPreviousSibling(); node!= 0; node=node->getPreviousSibling()) {
        i++;
    }
    return i;
}